

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_base.h
# Opt level: O0

void __thiscall
draco::EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::Reset
          (EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_> *this)

{
  EncoderOptionsBase<draco::GeometryAttribute::Type> *in_RDI;
  EncoderOptionsBase<draco::GeometryAttribute::Type> *this_00;
  EncoderOptionsBase<draco::GeometryAttribute::Type> local_98;
  
  this_00 = &local_98;
  EncoderOptionsBase<draco::GeometryAttribute::Type>::CreateDefaultOptions();
  EncoderOptionsBase<draco::GeometryAttribute::Type>::operator=(this_00,in_RDI);
  EncoderOptionsBase<draco::GeometryAttribute::Type>::~EncoderOptionsBase(this_00);
  return;
}

Assistant:

void Reset() { options_ = EncoderOptionsT::CreateDefaultOptions(); }